

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int Cudd_EstimateCofactor(DdManager *dd,DdNode *f,int i,int phase)

{
  int iVar1;
  st__table *table;
  DdNode *ptr;
  
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = cuddEstimateCofactor(dd,table,(DdNode *)((ulong)f & 0xfffffffffffffffe),i,phase,&ptr);
    ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
    st__free_table(table);
  }
  return iVar1;
}

Assistant:

int
Cudd_EstimateCofactor(
  DdManager *dd /* manager */,
  DdNode * f    /* function */,
  int i         /* index of variable */,
  int phase     /* 1: positive; 0: negative */
  )
{
    int val;
    DdNode *ptr;
    st__table *table;

    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) return(CUDD_OUT_OF_MEM);
    val = cuddEstimateCofactor(dd,table,Cudd_Regular(f),i,phase,&ptr);
    ddClearFlag(Cudd_Regular(f));
    st__free_table(table);

    return(val);

}